

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuVector.hpp
# Opt level: O3

void deqp::gles3::Functional::eval_divVecScalar_ivec4(ShaderEvalContext *c)

{
  float fVar1;
  int i;
  long lVar2;
  Vector<int,_4> res_1;
  Vector<int,_4> res;
  
  res.m_data[0] = (int)c->in[0].m_data[1];
  res.m_data[1] = (int)c->in[0].m_data[2];
  res.m_data[2] = (int)c->in[0].m_data[3];
  res.m_data[3] = (int)c->in[0].m_data[0];
  fVar1 = c->in[1].m_data[0];
  res_1.m_data[0] = 0;
  res_1.m_data[1] = 0;
  res_1.m_data[2] = 0;
  res_1.m_data[3] = 0;
  lVar2 = 0;
  do {
    res_1.m_data[lVar2] = res.m_data[lVar2] / (int)fVar1;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 4);
  (c->color).m_data[0] = (float)res_1.m_data[0];
  (c->color).m_data[1] = (float)res_1.m_data[1];
  (c->color).m_data[2] = (float)res_1.m_data[2];
  (c->color).m_data[3] = (float)res_1.m_data[3];
  return;
}

Assistant:

Vector<T, 4>			swizzle		(int a, int b, int c, int d) const { DE_ASSERT(a >= 0 && a < Size); DE_ASSERT(b >= 0 && b < Size); DE_ASSERT(c >= 0 && c < Size); DE_ASSERT(d >= 0 && d < Size); return Vector<T, 4>(m_data[a], m_data[b], m_data[c], m_data[d]); }